

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O2

void __thiscall
message_test_should_create_repeating_group_Test::~message_test_should_create_repeating_group_Test
          (message_test_should_create_repeating_group_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(message_test, should_create_repeating_group)
{
    Fixpp::v42::Message::Logon logon;

    using namespace Fixpp;

    // First, we create a new group and add 2 instances

    auto group = Fixpp::createGroup<Tag::NoMsgTypes>(logon, 2);
    auto instance = group.instance();

    Fixpp::set<Tag::RefMsgType>(instance, "TEST");
    Fixpp::set<Tag::MsgDirection>(instance, 'S');

    ASSERT_EQ(Fixpp::get<Tag::RefMsgType>(instance), "TEST");
    ASSERT_EQ(Fixpp::get<Tag::MsgDirection>(instance), 'S');

    group.add(instance);

    Fixpp::set<Tag::RefMsgType>(instance, "MD");
    Fixpp::set<Tag::MsgDirection>(instance, 'S');

    ASSERT_EQ(Fixpp::get<Tag::RefMsgType>(instance), "MD");
    ASSERT_EQ(Fixpp::get<Tag::MsgDirection>(instance), 'S');

    group.add(instance);

    ASSERT_EQ(group.size(), 2);

    // Let's now check that values have been written in the message itself
    auto& values = logon.values;

    // NoMsgTypes RepeatinGroup is the 7th field in the Logon message
    auto& repeatingGroup = meta::get<6>(values);

    ASSERT_FALSE(repeatingGroup.empty());
    ASSERT_EQ(repeatingGroup.size(), 2);

    const auto& groupValues = repeatingGroup.get();
    ASSERT_EQ(groupValues.size(), 2);

    ASSERT_EQ(meta::get<0>(groupValues[0].values).get(), "TEST");
    ASSERT_EQ(meta::get<1>(groupValues[0].values).get(), 'S');

    ASSERT_EQ(meta::get<0>(groupValues[1].values).get(), "MD");
    ASSERT_EQ(meta::get<1>(groupValues[1].values).get(), 'S');
}